

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          f)

{
  BoundArgFunction<Catch::ConfigData> *this_00;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffd8;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffe0;
  BoundArgFunction<Catch::ConfigData> in_stack_ffffffffffffffe8;
  
  this_00 = (BoundArgFunction<Catch::ConfigData> *)&stack0xffffffffffffffe8;
  Detail::makeBoundField<Catch::ConfigData,std::__cxx11::string>
            ((offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_ffffffffffffffe8.functionObj);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(this_00);
  return;
}

Assistant:

void bindProcessName( F f ) {
            m_boundProcessName = Detail::makeBoundField( f );
        }